

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O2

void test_write_format_zip_large(void)

{
  long lVar1;
  fileblock *__ptr;
  int iVar2;
  wchar_t wVar3;
  fileblocks *fileblocks;
  archive *paVar4;
  archive_entry *paVar5;
  la_ssize_t lVar6;
  ulong uVar7;
  void *__ptr_00;
  size_t __n;
  unsigned_long_long uVar8;
  void *_v1;
  unsigned_long_long uVar9;
  fileblock *b;
  size_t s;
  long lVar10;
  ulong s_00;
  long v1;
  void *p_;
  void *_v1_00;
  void *local_80;
  char namebuff [64];
  
  fileblocks = (fileblocks *)calloc(1,0x38);
  nullsize = 1;
  nulldata = malloc(0x100000);
  memset(nulldata,0xaa,0x100000);
  paVar4 = archive_write_new();
  archive_write_set_format_zip(paVar4);
  iVar2 = archive_write_set_options(paVar4,"zip:compression=store");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ŏ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_options(a, \"zip:compression=store\")",paVar4);
  iVar2 = archive_write_set_options(paVar4,"zip:fakecrc32");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ő',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_options(a, \"zip:fakecrc32\")",paVar4);
  iVar2 = archive_write_set_bytes_per_block(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'œ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_bytes_per_block(a, 0)",
                      paVar4);
  iVar2 = archive_write_open(paVar4,fileblocks,(undefined1 *)0x0,memory_write,(undefined1 *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ŕ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open(a, fileblocks, NULL, memory_write, NULL)",paVar4);
  for (uVar7 = 0; uVar7 != 7; uVar7 = uVar7 + 1) {
    paVar5 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                     ,L'ś',(uint)(paVar5 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    snprintf(namebuff,0x40,"file_%d",uVar7 & 0xffffffff);
    archive_entry_copy_pathname(paVar5,namebuff);
    archive_entry_set_mode(paVar5,0x81ed);
    s_00 = test_sizes[uVar7];
    archive_entry_set_size(paVar5,s_00);
    iVar2 = archive_write_header(paVar4,paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'ţ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    archive_entry_free(paVar5);
    for (; 0 < (long)s_00; s_00 = s_00 - s) {
      s = 0x100000;
      if (s_00 < 0x100000) {
        s = s_00;
      }
      lVar6 = archive_write_data(paVar4,nulldata,s);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                          ,L'Ů',s,"(int)writesize",(long)(int)lVar6,
                          "(int)archive_write_data(a, nulldata, writesize)",paVar4);
    }
  }
  paVar5 = archive_entry_new();
  v1 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'ų',(uint)(paVar5 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar5,"lastfile");
  archive_entry_set_mode(paVar5,0x81ed);
  iVar2 = archive_write_header(paVar4,paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'Ŷ',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ź',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ż',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  wVar3 = archive_read_support_format_zip_seekable(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƃ',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_read_support_format_zip_seekable(a)",paVar4);
  verify_large_zip(paVar4,fileblocks,1);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƅ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  wVar3 = archive_read_support_format_zip_streamable(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƌ',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_read_support_format_zip_streamable(a)",paVar4);
  verify_large_zip(paVar4,fileblocks,0);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƍ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  paVar4 = (archive *)0x2000;
  __ptr_00 = malloc(0x2000);
  memory_read_open(paVar4,fileblocks);
  memory_read_seek(paVar4,fileblocks,-0x2000,2);
  while( true ) {
    __n = memory_read(paVar4,fileblocks,&local_80);
    if (__n == 0) break;
    paVar4 = (archive *)((long)__ptr_00 + v1);
    memcpy(paVar4,local_80,__n);
    v1 = v1 + __n;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ɯ',v1,"buffsize",0x2000,"FINAL_SIZE",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƣ',(void *)((long)__ptr_00 + v1 + -0x16),"eocd","PK\x05\x06",
                      "\"PK\\005\\006\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƣ',(void *)((long)__ptr_00 + v1 + -0xe),"eocd + 8","\b",
                      "\"\\010\\0\\010\\0\"",4,"4",(void *)0x0);
  i4le((void *)((long)__ptr_00 + v1 + -10));
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʀ',(void *)((long)__ptr_00 + v1 + -6),"eocd + 16",anon_var_dwarf_13e126,
                      "\"\\xff\\xff\\xff\\xff\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƨ',(void *)((long)__ptr_00 + v1 + -2),"eocd + 20","","\"\\0\\0\"",2,"2",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƫ',(void *)((long)__ptr_00 + v1 + -0x2a),"zip64_locator","PK\x06\a",
                      "\"PK\\006\\007\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  lVar10 = fileblocks->filesize;
  uVar8 = i8le((void *)((long)__ptr_00 + v1 + -0x22));
  lVar10 = uVar8 - lVar10;
  _v1 = (void *)((long)__ptr_00 + lVar10 + v1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƭ',(void *)((long)__ptr_00 + v1 + -0x1a),"zip64_locator + 16","\x01",
                      "\"\\001\\0\\0\\0\"",4,"4",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'ư',(uint)(lVar10 == -0x62),"zip64_eocd == p - 98",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʊ',_v1,"zip64_eocd","PK\x06\x06","\"PK\\006\\006\"",4,"4",(void *)0x0);
  uVar8 = i8le((void *)((long)_v1 + 4));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʋ',0x2c,"44",uVar8,"i8le(zip64_eocd + 4)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƴ',(void *)((long)__ptr_00 + lVar10 + v1 + 0xc),"zip64_eocd + 12","-",
                      "\"\\055\\0\"",2,"2",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƴ',(void *)((long)__ptr_00 + lVar10 + v1 + 0xe),"zip64_eocd + 14","-",
                      "\"\\055\\0\"",2,"2",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƶ',(void *)((long)__ptr_00 + lVar10 + v1 + 0x10),"zip64_eocd + 16","",
                      "\"\\0\\0\\0\\0\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƶ',(void *)((long)__ptr_00 + lVar10 + v1 + 0x14),"zip64_eocd + 20","",
                      "\"\\0\\0\\0\\0\"",4,"4",(void *)0x0);
  uVar8 = i8le((void *)((long)__ptr_00 + lVar10 + v1 + 0x18));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʒ',8,"8",uVar8,"i8le(zip64_eocd + 24)",(void *)0x0);
  uVar8 = i8le((void *)((long)__ptr_00 + lVar10 + v1 + 0x20));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƹ',8,"8",uVar8,"i8le(zip64_eocd + 32)",(void *)0x0);
  uVar8 = i8le((void *)((long)__ptr_00 + lVar10 + v1 + 0x28));
  lVar1 = fileblocks->filesize;
  p_ = (void *)((long)__ptr_00 + lVar10 + v1 + 0x30);
  uVar9 = i8le(p_);
  _v1_00 = (void *)((long)__ptr_00 + (uVar9 - lVar1) + v1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'Ƽ',(uint)((void *)(uVar8 + (long)_v1_00) == _v1),
                   "cd_start + cd_size == zip64_eocd",(void *)0x0);
  uVar9 = i8le(p_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ǃ',uVar8 + uVar9 + 0x62,"i8le(zip64_eocd + 48) + cd_size + 56 + 20 + 22",
                      fileblocks->filesize,"fileblocks->filesize",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ǆ',_v1_00,"cd_start","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  while (__ptr = fileblocks->first, __ptr != (fileblock *)0x0) {
    fileblocks->first = __ptr->next;
    free(__ptr->buff);
    free(__ptr);
  }
  free(fileblocks);
  free(__ptr_00);
  free(nulldata);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_large)
{
	int i;
	char namebuff[64];
	struct fileblocks *fileblocks = fileblocks_new();
	struct archive_entry *ae;
	struct archive *a;
	const char *p;
	const char *cd_start, *zip64_eocd, *zip64_locator, *eocd;
	int64_t cd_size;
	char *buff;
	int64_t  filesize;
	size_t writesize, buffsize, s;

	nullsize = (size_t)(1 * MB);
	nulldata = malloc(nullsize);
	memset(nulldata, 0xAA, nullsize);

	/*
	 * Open an archive for writing.
	 */
	a = archive_write_new();
	archive_write_set_format_zip(a);
	/* TODO: Repeat this entire test suite with default compression */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:compression=store"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:fakecrc32"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 0)); /* No buffering. */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open(a, fileblocks, NULL, memory_write, NULL));

	/*
	 * Write a series of large files to it.
	 */
	for (i = 0; test_sizes[i] != 0; i++) {
		assert((ae = archive_entry_new()) != NULL);
		snprintf(namebuff, sizeof(namebuff), "file_%d", i);
		archive_entry_copy_pathname(ae, namebuff);
		archive_entry_set_mode(ae, S_IFREG | 0755);
		filesize = test_sizes[i];
		archive_entry_set_size(ae, filesize);

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_header(a, ae));
		archive_entry_free(ae);

		/*
		 * Write the actual data to the archive.
		 */
		while (filesize > 0) {
			writesize = nullsize;
			if ((int64_t)writesize > filesize)
				writesize = (size_t)filesize;
			assertEqualIntA(a, (int)writesize,
			    (int)archive_write_data(a, nulldata, writesize));
			filesize -= writesize;
		}
	}

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "lastfile");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Read back with seeking reader:
	 */
	a = archive_read_new();
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_zip_seekable(a));
	verify_large_zip(a, fileblocks, 1);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Read back with streaming reader:
	 */
	a = archive_read_new();
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_zip_streamable(a));
	verify_large_zip(a, fileblocks, 0);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Manually verify some of the final bytes of the archives.
	 */
	/* Collect the final bytes together */
#define FINAL_SIZE 8192
	buff = malloc(FINAL_SIZE);
	buffsize = 0;
	memory_read_open(NULL, fileblocks);
	memory_read_seek(NULL, fileblocks, -FINAL_SIZE, SEEK_END);
	while ((s = memory_read(NULL, fileblocks, (const void **)&p)) > 0) {
		memcpy(buff + buffsize, p, s);
		buffsize += s;
	}
	assertEqualInt(buffsize, FINAL_SIZE);

	p = buff + buffsize;

	/* Verify regular end-of-central-directory record */
	eocd = p - 22;
	assertEqualMem(eocd, "PK\005\006\0\0\0\0", 8);
	assertEqualMem(eocd + 8, "\010\0\010\0", 4); /* 8 entries total */
	cd_size = i4le(eocd + 12);
	/* Start of CD offset should be 0xffffffff */
	assertEqualMem(eocd + 16, "\xff\xff\xff\xff", 4);
	assertEqualMem(eocd + 20, "\0\0", 2);	/* No Zip comment */

	/* Verify Zip64 locator */
	zip64_locator = p - 42;
	assertEqualMem(zip64_locator, "PK\006\007\0\0\0\0", 8);
	zip64_eocd = p - (fileblocks->filesize - i8le(zip64_locator + 8));
	assertEqualMem(zip64_locator + 16, "\001\0\0\0", 4);

	/* Verify Zip64 end-of-cd record. */
	assert(zip64_eocd == p - 98);
	assertEqualMem(zip64_eocd, "PK\006\006", 4);
	assertEqualInt(44, i8le(zip64_eocd + 4)); // Size of EoCD record - 12
	assertEqualMem(zip64_eocd + 12, "\055\0", 2);  // Made by version: 45
	assertEqualMem(zip64_eocd + 14, "\055\0", 2);  // Requires version: 45
	assertEqualMem(zip64_eocd + 16, "\0\0\0\0", 4); // This disk
	assertEqualMem(zip64_eocd + 20, "\0\0\0\0", 4); // Total disks
	assertEqualInt(8, i8le(zip64_eocd + 24));  // Entries on this disk
	assertEqualInt(8, i8le(zip64_eocd + 32));  // Total entries
	cd_size = i8le(zip64_eocd + 40);
	cd_start = p - (fileblocks->filesize - i8le(zip64_eocd + 48));

	assert(cd_start + cd_size == zip64_eocd);

	assertEqualInt(i8le(zip64_eocd + 48) // Start of CD
	    + cd_size
	    + 56 // Size of Zip64 EOCD
	    + 20 // Size of Zip64 locator
	    + 22, // Size of EOCD
	    fileblocks->filesize);

	// TODO: Scan entire Central Directory, sanity-check all data
	assertEqualMem(cd_start, "PK\001\002", 4);

	fileblocks_free(fileblocks);
	free(buff);
	free(nulldata);
}